

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslserver_p.h
# Opt level: O2

void __thiscall QSslServerPrivate::SocketData::disconnectSignals(SocketData *this)

{
  long in_FS_OFFSET;
  Connection __old_val;
  Connection local_30;
  Connection local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QMetaObject::Connection::Connection(&local_30);
  local_28.d_ptr = (this->readyReadConnection).d_ptr;
  (this->readyReadConnection).d_ptr = local_30.d_ptr;
  local_30.d_ptr = (void *)0x0;
  QObject::disconnect(&local_28);
  QMetaObject::Connection::~Connection(&local_28);
  QMetaObject::Connection::~Connection(&local_30);
  QMetaObject::Connection::Connection(&local_30);
  local_28.d_ptr = (this->destroyedConnection).d_ptr;
  (this->destroyedConnection).d_ptr = local_30.d_ptr;
  local_30.d_ptr = (void *)0x0;
  QObject::disconnect(&local_28);
  QMetaObject::Connection::~Connection(&local_28);
  QMetaObject::Connection::~Connection(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void disconnectSignals()
        {
            QObject::disconnect(std::exchange(readyReadConnection, {}));
            QObject::disconnect(std::exchange(destroyedConnection, {}));
        }